

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_uniform(Context *ctx,RegisterType regtype,int regnum,VariableList *var)

{
  int iVar1;
  uint local_ac;
  int arraybase;
  int index;
  char name [64];
  char varname [64];
  char *utype;
  VariableList *var_local;
  int regnum_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  get_METAL_uniform_type(ctx,regtype);
  local_ac = 0;
  get_METAL_varname_in_buf(ctx,regtype,regnum,name + 0x38,0x40);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  if (var == (VariableList *)0x0) {
    get_METAL_uniform_array_varname(ctx,regtype,(char *)&arraybase,0x40);
    if (regtype == REG_TYPE_CONST) {
      local_ac = ctx->uniform_float4_count;
    }
    else if (regtype == REG_TYPE_CONSTINT) {
      local_ac = ctx->uniform_int4_count;
    }
    else if (regtype == REG_TYPE_CONSTBOOL) {
      local_ac = ctx->uniform_bool_count;
    }
    else {
      iVar1 = isfail(ctx);
      if (iVar1 == 0) {
        __assert_fail("isfail(ctx)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x12a2,
                      "void emit_METAL_uniform(Context *, RegisterType, int, const VariableList *)")
        ;
      }
    }
    output_line(ctx,"#define %s %s[%d]",name + 0x38,&arraybase,(ulong)local_ac);
    push_output(ctx,&ctx->mainline);
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"#undef %s",name + 0x38);
    pop_output(ctx);
  }
  else {
    iVar1 = var->index;
    if (var->constant == (ConstantsList *)0x0) {
      if (var->emit_position == -1) {
        __assert_fail("var->emit_position != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x12b8,
                      "void emit_METAL_uniform(Context *, RegisterType, int, const VariableList *)")
        ;
      }
      get_METAL_uniform_array_varname(ctx,regtype,(char *)&arraybase,0x40);
      local_ac = (regnum - iVar1) + var->emit_position;
    }
    else {
      get_METAL_const_array_varname_in_buf(ctx,iVar1,var->count,(char *)&arraybase,0x40);
      local_ac = regnum - iVar1;
    }
    output_line(ctx,"#define %s %s[%d];",name + 0x38,&arraybase,(ulong)local_ac);
    push_output(ctx,&ctx->mainline);
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"#undef %s",name + 0x38);
    pop_output(ctx);
  }
  pop_output(ctx);
  return;
}

Assistant:

static void emit_METAL_uniform(Context *ctx, RegisterType regtype, int regnum,
                              const VariableList *var)
{
    // Now that we're pushing all the uniforms as one struct, pack these
    //  down, so if we only use register c439, it'll actually map to
    //  uniforms.uniforms_float4[0]. As we push one big struct, this will
    //  prevent uploading unused data.

    const char *utype = get_METAL_uniform_type(ctx, regtype);
    char varname[64];
    char name[64];
    int index = 0;

    get_METAL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;

    if (var == NULL)
    {
        get_METAL_uniform_array_varname(ctx, regtype, name, sizeof (name));

        if (regtype == REG_TYPE_CONST)
            index = ctx->uniform_float4_count;
        else if (regtype == REG_TYPE_CONSTINT)
            index = ctx->uniform_int4_count;
        else if (regtype == REG_TYPE_CONSTBOOL)
            index = ctx->uniform_bool_count;
        else  // get_METAL_uniform_array_varname() would have called fail().
            assert(isfail(ctx));

        // !!! FIXME: can cause unused var warnings in Clang...
        //output_line(ctx, "constant %s &%s = %s[%d];", utype, varname, name, index);
        output_line(ctx, "#define %s %s[%d]", varname, name, index);
        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "#undef %s", varname);  // !!! FIXME: gross.
        pop_output(ctx);
    } // if

    else
    {
        const int arraybase = var->index;
        if (var->constant)
        {
            get_METAL_const_array_varname_in_buf(ctx, arraybase, var->count,
                                                name, sizeof (name));
            index = (regnum - arraybase);
        } // if
        else
        {
            assert(var->emit_position != -1);
            get_METAL_uniform_array_varname(ctx, regtype, name, sizeof (name));
            index = (regnum - arraybase) + var->emit_position;
        } // else

        // !!! FIXME: might trigger unused var warnings in Clang.
        //output_line(ctx, "constant %s &%s = %s[%d];", utype, varname, name, index);
        output_line(ctx, "#define %s %s[%d];", varname, name, index);
        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "#undef %s", varname);  // !!! FIXME: gross.
        pop_output(ctx);
    } // else

    pop_output(ctx);
}